

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_mountHandle(PHYSFS_File *file,char *fname,char *mountPoint,int appendToPath)

{
  PHYSFS_Io *io_00;
  PHYSFS_Io *io;
  int retval;
  int appendToPath_local;
  char *mountPoint_local;
  char *fname_local;
  PHYSFS_File *file_local;
  
  if (file == (PHYSFS_File *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    file_local._4_4_ = 0;
  }
  else if (fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    file_local._4_4_ = 0;
  }
  else {
    io_00 = __PHYSFS_createHandleIo(file);
    if (io_00 == (PHYSFS_Io *)0x0) {
      file_local._4_4_ = 0;
    }
    else {
      file_local._4_4_ = doMount(io_00,fname,mountPoint,appendToPath);
      if (file_local._4_4_ == 0) {
        io_00->opaque = (void *)0x0;
        (*io_00->destroy)(io_00);
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int PHYSFS_mountHandle(PHYSFS_File *file, const char *fname,
                       const char *mountPoint, int appendToPath)
{
    int retval = 0;
    PHYSFS_Io *io = NULL;

    BAIL_IF(!file, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    io = __PHYSFS_createHandleIo(file);
    BAIL_IF_ERRPASS(!io, 0);
    retval = doMount(io, fname, mountPoint, appendToPath);
    if (!retval)
    {
        /* docs say not to destruct in case of failure, so cheat. */
        io->opaque = NULL;
        io->destroy(io);
    } /* if */

    return retval;
}